

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv.cpp
# Opt level: O0

int32_t ucnv_convert_63(char *toConverterName,char *fromConverterName,char *target,
                       int32_t targetCapacity,char *source,int32_t sourceLength,
                       UErrorCode *pErrorCode)

{
  UBool UVar1;
  int32_t iVar2;
  UConverter *inConverter_00;
  UConverter *outConverter_00;
  int32_t targetLength;
  UConverter *outConverter;
  UConverter *inConverter;
  UConverter out;
  UConverter in;
  int32_t sourceLength_local;
  char *source_local;
  int32_t targetCapacity_local;
  char *target_local;
  char *fromConverterName_local;
  char *toConverterName_local;
  
  if ((pErrorCode == (UErrorCode *)0x0) || (UVar1 = U_FAILURE(*pErrorCode), UVar1 != '\0')) {
    return 0;
  }
  if (((source == (char *)0x0) || ((sourceLength < -1 || (targetCapacity < 0)))) ||
     ((0 < targetCapacity && (target == (char *)0x0)))) {
    *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
    return 0;
  }
  if ((sourceLength == 0) || ((sourceLength < 0 && (*source == '\0')))) {
    iVar2 = u_terminateChars_63(target,targetCapacity,0,pErrorCode);
    return iVar2;
  }
  inConverter_00 =
       ucnv_createConverter_63((UConverter *)(out.preToU + 0x1e),fromConverterName,pErrorCode);
  UVar1 = U_FAILURE(*pErrorCode);
  if (UVar1 != '\0') {
    return 0;
  }
  outConverter_00 = ucnv_createConverter_63((UConverter *)&inConverter,toConverterName,pErrorCode);
  UVar1 = U_FAILURE(*pErrorCode);
  if (UVar1 != '\0') {
    ucnv_close_63(inConverter_00);
    return 0;
  }
  iVar2 = ucnv_internalConvert
                    (outConverter_00,inConverter_00,target,targetCapacity,source,sourceLength,
                     pErrorCode);
  ucnv_close_63(inConverter_00);
  ucnv_close_63(outConverter_00);
  return iVar2;
}

Assistant:

U_CAPI int32_t U_EXPORT2
ucnv_convert(const char *toConverterName, const char *fromConverterName,
             char *target, int32_t targetCapacity,
             const char *source, int32_t sourceLength,
             UErrorCode *pErrorCode) {
    UConverter in, out; /* stack-allocated */
    UConverter *inConverter, *outConverter;
    int32_t targetLength;

    if(pErrorCode==NULL || U_FAILURE(*pErrorCode)) {
        return 0;
    }

    if( source==NULL || sourceLength<-1 ||
        targetCapacity<0 || (targetCapacity>0 && target==NULL)
    ) {
        *pErrorCode=U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }

    /* if there is no input data, we're done */
    if(sourceLength==0 || (sourceLength<0 && *source==0)) {
        return u_terminateChars(target, targetCapacity, 0, pErrorCode);
    }

    /* create the converters */
    inConverter=ucnv_createConverter(&in, fromConverterName, pErrorCode);
    if(U_FAILURE(*pErrorCode)) {
        return 0;
    }

    outConverter=ucnv_createConverter(&out, toConverterName, pErrorCode);
    if(U_FAILURE(*pErrorCode)) {
        ucnv_close(inConverter);
        return 0;
    }

    targetLength=ucnv_internalConvert(outConverter, inConverter,
                                      target, targetCapacity,
                                      source, sourceLength,
                                      pErrorCode);

    ucnv_close(inConverter);
    ucnv_close(outConverter);

    return targetLength;
}